

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O1

void __thiscall
spdlog::logger::set_pattern(logger *this,string *pattern,pattern_time_type time_type)

{
  element_type *peVar1;
  pointer psVar2;
  _Alloc_hider _Var3;
  pointer *__ptr;
  pointer psVar4;
  __single_object new_formatter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_48.field_2._12_4_ = time_type;
  std::make_unique<spdlog::pattern_formatter,std::__cxx11::string,spdlog::pattern_time_type&>
            (&local_48,(pattern_time_type *)pattern);
  _Var3._M_p = local_48._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)0x0;
  psVar4 = (this->sinks_).
           super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->sinks_).
           super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar4 != psVar2) {
    do {
      peVar1 = (psVar4->super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      psVar4 = psVar4 + 1;
      if (psVar4 == psVar2) {
        local_48.field_2._M_allocated_capacity = (size_type)_Var3._M_p;
        (*peVar1->_vptr_sink[5])(peVar1);
        if ((long *)local_48.field_2._M_allocated_capacity != (long *)0x0) {
          (**(code **)(*(long *)local_48.field_2._M_allocated_capacity + 8))();
        }
        local_48.field_2._M_allocated_capacity = 0;
        _Var3._M_p = (pointer)0x0;
        break;
      }
      (**(code **)(*(long *)_Var3._M_p + 0x18))(&local_48._M_string_length,_Var3._M_p);
      (*peVar1->_vptr_sink[5])(peVar1,&local_48._M_string_length);
      if ((long *)local_48._M_string_length != (long *)0x0) {
        (**(code **)(*(long *)local_48._M_string_length + 8))();
      }
      local_48._M_string_length = 0;
      psVar2 = (this->sinks_).
               super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (psVar4 != psVar2);
  }
  if ((long *)_Var3._M_p != (long *)0x0) {
    (**(code **)(*(long *)_Var3._M_p + 8))(_Var3._M_p);
  }
  if ((pattern_formatter *)local_48._M_dataplus._M_p != (pattern_formatter *)0x0) {
    std::default_delete<spdlog::pattern_formatter>::operator()
              ((default_delete<spdlog::pattern_formatter> *)&local_48,
               (pattern_formatter *)local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

SPDLOG_INLINE void logger::set_pattern(std::string pattern, pattern_time_type time_type)
{
    auto new_formatter = details::make_unique<pattern_formatter>(std::move(pattern), time_type);
    set_formatter(std::move(new_formatter));
}